

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O2

void nn_ws_handshake_start
               (nn_ws_handshake *self,nn_usock *usock,nn_pipebase *pipebase,int mode,char *resource,
               char *host)

{
  size_t sVar1;
  char *pcVar2;
  undefined8 uVar3;
  
  if ((mode == 1) && (*resource == '\0')) {
    nn_backtrace_print();
    pcVar2 = "strlen (resource) >= 1";
    uVar3 = 0xc3;
  }
  else {
    if ((self->usock == (nn_usock *)0x0) && ((self->usock_owner).fsm == (nn_fsm *)0x0)) {
      (self->usock_owner).src = 1;
      (self->usock_owner).fsm = &self->fsm;
      nn_usock_swap_owner(usock,&self->usock_owner);
      self->usock = usock;
      self->pipebase = pipebase;
      self->mode = mode;
      self->resource = resource;
      self->remote_host = host;
      memset(self->response,0,0x200);
      self->recv_pos = 0;
      memset(self->opening_hs,0,0x1004);
      sVar1 = 0x97;
      if (mode != 2) {
        if (mode != 1) {
          nn_backtrace_print();
          pcVar2 = "0";
          uVar3 = 0xea;
          goto LAB_001361aa;
        }
        sVar1 = 0x10;
      }
      self->recv_len = sVar1;
      nn_fsm_start(&self->fsm);
      return;
    }
    nn_backtrace_print();
    pcVar2 = "self->usock == NULL && self->usock_owner.fsm == NULL";
    uVar3 = 0xc6;
  }
LAB_001361aa:
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
          ,uVar3);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_ws_handshake_start (struct nn_ws_handshake *self,
    struct nn_usock *usock, struct nn_pipebase *pipebase,
    int mode, const char *resource, const char *host)
{
    /*  It's expected this resource has been allocated during intial connect. */
    if (mode == NN_WS_CLIENT)
        nn_assert (strlen (resource) >= 1);

    /*  Take ownership of the underlying socket. */
    nn_assert (self->usock == NULL && self->usock_owner.fsm == NULL);
    self->usock_owner.src = NN_WS_HANDSHAKE_SRC_USOCK;
    self->usock_owner.fsm = &self->fsm;
    nn_usock_swap_owner (usock, &self->usock_owner);
    self->usock = usock;
    self->pipebase = pipebase;
    self->mode = mode;
    self->resource = resource;
    self->remote_host = host;

    memset (self->opening_hs, 0, sizeof (self->opening_hs));
    memset (self->response, 0, sizeof (self->response));

    self->recv_pos = 0;
    self->retries = 0;

    /*  Calculate the absolute minimum length possible for a valid opening
        handshake. This is an optimization since we must poll for the
        remainder of the opening handshake in small byte chunks. */
    switch (self->mode) {
    case NN_WS_SERVER:
        self->recv_len = strlen (
            "GET x HTTP/1.1\r\n"
            "Upgrade: websocket\r\n"
            "Connection: Upgrade\r\n"
            "Host: x\r\n"
            "Origin: x\r\n"
            "Sec-WebSocket-Key: xxxxxxxxxxxxxxxxxxxxxxxx\r\n"
            "Sec-WebSocket-Version: xx\r\n\r\n");
        break;
    case NN_WS_CLIENT:
        /*  Shortest conceiveable response from server is a terse status. */
        self->recv_len = strlen ("HTTP/1.1 xxx\r\n\r\n");
        break;
    default:
        /*  Developer error; unexpected mode. */
        nn_assert (0);
        break;
    }

    /*  Launch the state machine. */
    nn_fsm_start (&self->fsm);
}